

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.h
# Opt level: O0

ostream * operator<<(ostream *out,Company *cp)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Company *this;
  ostream *poVar5;
  void *pvVar6;
  double dVar7;
  int local_104;
  undefined1 local_100 [4];
  int i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  undefined1 local_c0 [68];
  int local_7c;
  undefined1 local_78 [4];
  int i_1;
  undefined1 local_58 [44];
  int i;
  bool flag;
  Company *local_20;
  Company *temp;
  Company *cp_local;
  ostream *out_local;
  
  temp = cp;
  cp_local = (Company *)out;
  this = (Company *)operator_new(0x18);
  Company::Company(this,temp);
  local_58[0x2b] = 1;
  local_20 = this;
  while ((local_58[0x2b] & 1) != 0) {
    local_58[0x2b] = 0;
    for (local_58._36_4_ = 0; uVar1 = local_58._36_4_,
        iVar3 = Boss::getNumberOfEmployees(local_20->boss), (int)uVar1 < iVar3 + -1;
        local_58._36_4_ = local_58._36_4_ + 1) {
      Person::getName_abi_cxx11_((Person *)local_58);
      Person::getName_abi_cxx11_((Person *)local_78);
      bVar2 = std::operator>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string((string *)local_58);
      if (bVar2) {
        std::swap<Employee*>
                  (local_20->employees + (int)local_58._36_4_,
                   local_20->employees + (local_58._36_4_ + 1));
        local_58[0x2b] = 1;
      }
    }
  }
  local_58[0x2b] = 1;
  while ((local_58[0x2b] & 1) != 0) {
    local_58[0x2b] = 0;
    for (local_7c = 0; iVar3 = local_7c, iVar4 = Boss::getNumberOfEmployees(local_20->boss),
        iVar3 < iVar4 + -1; local_7c = local_7c + 1) {
      Person::getId_abi_cxx11_((Person *)local_c0);
      std::__cxx11::string::substr((ulong)(local_c0 + 0x20),(ulong)local_c0);
      Person::getId_abi_cxx11_((Person *)local_100);
      std::__cxx11::string::substr((ulong)local_e0,(ulong)local_100);
      bVar2 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_c0 + 0x20),local_e0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)local_100);
      std::__cxx11::string::~string((string *)(local_c0 + 0x20));
      std::__cxx11::string::~string((string *)local_c0);
      if (bVar2) {
        std::swap<Employee*>(local_20->employees + local_7c,local_20->employees + (local_7c + 1));
        local_58[0x2b] = 1;
      }
    }
  }
  poVar5 = std::operator<<((ostream *)cp_local,"Boss : ");
  poVar5 = operator<<(poVar5,local_20->boss);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  for (local_104 = 0; iVar3 = Boss::getNumberOfEmployees(local_20->boss), local_104 < iVar3;
      local_104 = local_104 + 1) {
    poVar5 = operator<<((ostream *)cp_local,local_20->employees[local_104]);
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    dVar7 = Employee::efficiency(local_20->employees[local_104]);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,dVar7);
    pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  return (ostream *)cp_local;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Company &cp) {
          auto *temp = new Company(cp);
        bool flag = true;
        while (flag) {
            flag = false;
            for (int i = 0; i < temp->boss->getNumberOfEmployees() - 1; ++i) {
                if (temp->employees[i]->getName() > temp->employees[i + 1]->getName()) {
                    std::swap(temp->employees[i], temp->employees[i + 1]);
                    flag = true;
                }
            }
        }
        flag = true;
        while (flag) {
            flag = false;
            for (int i = 0; i < temp->boss->getNumberOfEmployees() - 1; ++i) {
                if (temp->employees[i]->getId().substr(0, 2) < temp->employees[i + 1]->getId().substr(0, 2)) {
                    std::swap(temp->employees[i], temp->employees[i + 1]);
                    flag = true;
                }
            }
        }


        out << "Boss : "<<*(temp->boss) << std::endl << std::endl;
        for (int i = 0; i < temp->boss->getNumberOfEmployees(); ++i) {
            out << *(temp->employees[i]) << std::endl << temp->employees[i]->efficiency() << std::endl << std::endl;

        }
        return out;
    }